

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TransferFunction.cpp
# Opt level: O2

void __thiscall
rtb::Filter::TransferFunction<double>::getBode
          (TransferFunction<double> *this,vector<double,_std::allocator<double>_> *xValues,
          vector<double,_std::allocator<double>_> *gain,
          vector<double,_std::allocator<double>_> *phase)

{
  pointer pdVar1;
  uint i;
  uint uVar2;
  double dVar3;
  double dVar4;
  double local_38;
  
  pdVar1 = (xValues->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((xValues->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
      ._M_finish != pdVar1) {
    (xValues->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_finish = pdVar1;
  }
  pdVar1 = (gain->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((gain->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_finish != pdVar1) {
    (gain->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_finish = pdVar1;
  }
  pdVar1 = (phase->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((phase->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_finish != pdVar1) {
    (phase->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_finish = pdVar1;
  }
  uVar2 = 1;
  while( true ) {
    dVar4 = this->samplingFrequency_;
    dVar3 = ceil(dVar4 * 0.5);
    if ((uint)(long)dVar3 <= uVar2) break;
    local_38 = (double)uVar2;
    dVar4 = (6.283185307179586 / dVar4) * local_38;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>(xValues,&local_38);
    local_38 = getGainAt(this,dVar4);
    std::vector<double,_std::allocator<double>_>::emplace_back<double>(gain,&local_38);
    local_38 = getPhaseAt(this,dVar4);
    std::vector<double,_std::allocator<double>_>::emplace_back<double>(phase,&local_38);
    uVar2 = uVar2 + 1;
  }
  return;
}

Assistant:

void TransferFunction<T>::getBode(std::vector<double>& xValues, std::vector<double>& gain, std::vector<double>& phase) const {

            xValues.clear();
            gain.clear();
            phase.clear();

            for (unsigned i{ 1 }; i < static_cast<unsigned>(ceil(samplingFrequency_ / 2.)); ++i) {
                double w{ 2 * M_PI / samplingFrequency_ * i };
                xValues.push_back(i);
                gain.push_back(getGainAt(w));
                phase.push_back(getPhaseAt(w));
            }
        }